

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::TransformFeedbackTypes::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  TransformFeedbackTypes *this_local;
  
  local_18 = this;
  this_local = (TransformFeedbackTypes *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                      \nin vec4 position;                    \nflat out highp vec4 a;               \nout mediump float b[2];              \nflat out highp uvec2 c;              \nflat out highp uint d;               \nout mediump vec3 e[2];               \nflat out int f;                      \nvoid main(void)                      \n{                                    \n   vec4 pos;                         \n   a = vec4(1);                      \n   b[0] = 1.1;                       \n   b[1] = 1.1;                       \n   c = uvec2(1u);                    \n   d = 1u;                           \n   e[0] = vec3(1.1);                 \n   e[1] = vec3(1.1);                 \n   f = 1;                            \n   gl_Position = position;           \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                      \n"
			   "in vec4 position;                    \n"
			   ""
			   "flat out highp vec4 a;               \n"
			   "out mediump float b[2];              \n"
			   "flat out highp uvec2 c;              \n"
			   "flat out highp uint d;               \n"
			   "out mediump vec3 e[2];               \n"
			   "flat out int f;                      \n"
			   ""
			   "void main(void)                      \n"
			   "{                                    \n"
			   "   vec4 pos;                         \n"
			   "   a = vec4(1);                      \n"
			   "   b[0] = 1.1;                       \n"
			   "   b[1] = 1.1;                       \n"
			   "   c = uvec2(1u);                    \n"
			   "   d = 1u;                           \n"
			   "   e[0] = vec3(1.1);                 \n"
			   "   e[1] = vec3(1.1);                 \n"
			   "   f = 1;                            \n"
			   "   gl_Position = position;           \n"
			   "}";
	}